

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Buffer.cpp
# Opt level: O3

void __thiscall Buffer::RemoveReadChain(Buffer *this,uint32_t l)

{
  ushort uVar1;
  BufferChain *pBVar2;
  uint32_t uVar3;
  ushort uVar4;
  uint uVar5;
  BufferChain *pBVar6;
  uint uVar7;
  
  pBVar6 = this->m_head;
  if (l < this->len) {
    uVar7 = l;
    if (l != 0 && pBVar6 != (BufferChain *)0x0) {
      do {
        uVar1 = pBVar6->read;
        uVar4 = pBVar6->write - uVar1;
        if (pBVar6->write < uVar1) {
          __assert_fail("write >= read",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/alphavip[P]pollevent/loop/Buffer.cpp"
                        ,0x14,"uint16_t BufferChain::GetCanReadCount()");
        }
        uVar5 = uVar7;
        if ((uVar4 != 0) && (uVar5 = uVar7 - uVar4, uVar7 < uVar4)) {
          pBVar6->read = uVar1 + (short)uVar7;
          goto LAB_00104c2d;
        }
        pBVar6 = pBVar6->nextpkt;
        (*this->_vptr_Buffer[1])(this);
        this->m_head = pBVar6;
      } while ((pBVar6 != (BufferChain *)0x0) && (uVar7 = uVar5, uVar5 != 0));
    }
    if (pBVar6 == (BufferChain *)0x0) {
      this->m_end = (BufferChain *)0x0;
    }
LAB_00104c2d:
    this->len = this->len - l;
  }
  else {
    while (pBVar6 != (BufferChain *)0x0) {
      if (pBVar6->refcount == 0) {
        __assert_fail("tmp->refcount > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/alphavip[P]pollevent/loop/Buffer.h"
                      ,0x2d,"void Buffer::Clear()");
      }
      pBVar2 = pBVar6->nextpkt;
      uVar3 = pBVar6->refcount - 1;
      pBVar6->refcount = uVar3;
      pBVar6 = pBVar2;
      if (uVar3 == 0) {
        (*this->_vptr_Buffer[1])(this);
      }
    }
    this->len = 0;
    this->m_writeHead = (BufferChain *)0x0;
    this->m_writeTail = (BufferChain *)0x0;
    this->m_head = (BufferChain *)0x0;
    this->m_end = (BufferChain *)0x0;
  }
  return;
}

Assistant:

void Buffer::RemoveReadChain(uint32_t l)
{
    if(l >= len)
    {
        Clear();
        return;
    }
    uint32_t rlen = l;
    for(BufferChain* buff = this->m_head; buff != nullptr && rlen > 0;)
    {
        uint16_t canReadCount = buff->GetCanReadCount();
        if(canReadCount == 0)
        {
            BufferChain* bc = buff->nextpkt;
            Cycle(buff);
            buff = bc;
            m_head = bc;

            continue;
        }
        if(rlen < canReadCount)
        {
            buff->read += rlen;
            break;
        }
        else
        {
            rlen -= canReadCount;
            BufferChain* bc = buff->nextpkt;
            Cycle(buff);
            buff = bc;
            m_head = bc;
        }
    }
    if(m_head == nullptr)
        m_end = nullptr;

    len -= l;
}